

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Convolution::Convolution(Convolution *this,int filterLength,double *filter)

{
  uint n;
  int iVar1;
  int *ip;
  double *w;
  double *a;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar7;
  int iVar6;
  
  this->m_filter_len = filterLength;
  n = filterLength * 2;
  this->m_fft_len = n;
  iVar5 = 0;
  do {
    iVar6 = iVar5;
    iVar5 = iVar6 + 1;
    iVar1 = 2 << ((byte)iVar5 & 0x1f);
  } while (SBORROW4(iVar1,n) != iVar1 + filterLength * -2 < 0);
  this->m_fft_n = iVar5;
  iVar5 = 2 << ((byte)(iVar6 / 2) & 0x1f);
  iVar1 = 2 << ((byte)iVar6 & 0x1f);
  this->m_ip_len = iVar5 + 2;
  this->m_w_len = iVar1;
  uVar4 = 0xffffffffffffffff;
  uVar7 = (long)iVar5 * 4 + 8;
  if (iVar5 < -2) {
    uVar7 = uVar4;
  }
  ip = (int *)operator_new__(uVar7);
  this->m_ip = ip;
  uVar7 = (long)iVar1 * 8;
  if (iVar1 < 0) {
    uVar7 = uVar4;
  }
  w = (double *)operator_new__(uVar7);
  this->m_work = w;
  uVar7 = (ulong)n << 3;
  if (filterLength < 0) {
    uVar7 = uVar4;
  }
  a = (double *)operator_new__(uVar7);
  this->m_filter = a;
  pdVar2 = (double *)operator_new__(uVar7);
  this->m_fft_buff = pdVar2;
  pdVar2 = (double *)operator_new__(uVar7);
  this->m_filter_result = pdVar2;
  *ip = 0;
  uVar7 = 0;
  uVar4 = 0;
  if (0 < (int)n) {
    uVar4 = (ulong)n;
  }
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    pdVar2[uVar7] = 0.0;
  }
  uVar7 = 0;
  uVar4 = 0;
  if (0 < filterLength) {
    uVar4 = (ulong)(uint)filterLength;
  }
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    a[uVar7] = filter[uVar7] * (1.0 / (double)filterLength);
  }
  for (lVar3 = (long)filterLength; lVar3 < (int)n; lVar3 = lVar3 + 1) {
    a[lVar3] = 0.0;
  }
  rdft(n,1,a,ip,w);
  return;
}

Assistant:

Convolution(int filterLength, const double *filter)
	{
		m_filter_len = filterLength;
		m_fft_len = filterLength * 2;
		m_fft_n = 1;
		while ((2 << m_fft_n) < m_fft_len) {
			m_fft_n++;
		}
		m_ip_len = 2 + (2 << ((m_fft_n - 1)/2));
		m_w_len = 2 << (m_fft_n - 1);
		m_ip = new int[m_ip_len];
		m_work = new double[m_w_len];
		m_filter = new double[m_fft_len];
		m_fft_buff = new double[m_fft_len];
		m_filter_result = new double[m_fft_len];
		
		m_ip[0] = 0;
		
		for (int i=0; i<m_fft_len; ++i) {
			m_filter_result[i] = .0;
		}
		
		for (int i=0; i<m_filter_len; ++i) {
			m_filter[i] = filter[i] * (1.0 / m_filter_len);
		}
		for (int i=m_filter_len; i<m_fft_len; ++i) {
			m_filter[i] = .0;
		}
		rdft(m_fft_len, 1, m_filter, m_ip, m_work);
	}